

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_close_sockets.c
# Opt level: O2

void ares_check_cleanup_conns(ares_channel_t *channel)

{
  ares_slist_node_t *node;
  void *pvVar1;
  ares_llist_node_t *node_00;
  ares_llist_node_t *paVar2;
  ares_conn_t *conn;
  size_t sVar3;
  
  if (channel != (ares_channel_t *)0x0) {
    for (node = ares_slist_node_first(channel->servers); node != (ares_slist_node_t *)0x0;
        node = ares_slist_node_next(node)) {
      pvVar1 = ares_slist_node_val(node);
      node_00 = ares_llist_node_first(*(ares_llist_t **)((long)pvVar1 + 0x78));
      while (node_00 != (ares_llist_node_t *)0x0) {
        paVar2 = ares_llist_node_next(node_00);
        conn = (ares_conn_t *)ares_llist_node_val(node_00);
        sVar3 = ares_llist_len(conn->queries_to_conn);
        node_00 = paVar2;
        if (sVar3 == 0) {
          if (((((conn->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) &&
               (channel->udp_max_queries != 0)) && (channel->udp_max_queries <= conn->total_queries)
              ) || (conn->server->consec_failures != 0 || (channel->flags & 0x10) == 0)) {
            ares_close_connection(conn,ARES_SUCCESS);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ares_check_cleanup_conns(const ares_channel_t *channel)
{
  ares_slist_node_t *snode;

  if (channel == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  /* Iterate across each server */
  for (snode = ares_slist_node_first(channel->servers); snode != NULL;
       snode = ares_slist_node_next(snode)) {
    ares_server_t     *server = ares_slist_node_val(snode);
    ares_llist_node_t *cnode;

    /* Iterate across each connection */
    cnode = ares_llist_node_first(server->connections);
    while (cnode != NULL) {
      ares_llist_node_t *next       = ares_llist_node_next(cnode);
      ares_conn_t       *conn       = ares_llist_node_val(cnode);
      ares_bool_t        do_cleanup = ARES_FALSE;
      cnode                         = next;

      /* Has connections, not eligible */
      if (ares_llist_len(conn->queries_to_conn)) {
        continue;
      }

      /* If we are configured not to stay open, close it out */
      if (!(channel->flags & ARES_FLAG_STAYOPEN)) {
        do_cleanup = ARES_TRUE;
      }

      /* If the associated server has failures, close it out. Resetting the
       * connection (and specifically the source port number) can help resolve
       * situations where packets are being dropped.
       */
      if (conn->server->consec_failures > 0) {
        do_cleanup = ARES_TRUE;
      }

      /* If the udp connection hit its max queries, always close it */
      if (!(conn->flags & ARES_CONN_FLAG_TCP) && channel->udp_max_queries > 0 &&
          conn->total_queries >= channel->udp_max_queries) {
        do_cleanup = ARES_TRUE;
      }

      if (!do_cleanup) {
        continue;
      }

      /* Clean it up */
      ares_close_connection(conn, ARES_SUCCESS);
    }
  }
}